

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

llama_model_params *
common_model_params_to_llama(llama_model_params *__return_storage_ptr__,common_params *params)

{
  pointer ppgVar1;
  pointer plVar2;
  pointer plVar3;
  pointer plVar4;
  pointer plVar5;
  char *pcVar6;
  undefined8 uVar7;
  
  llama_model_default_params();
  ppgVar1 = (params->devices).
            super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppgVar1 !=
      (params->devices).
      super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __return_storage_ptr__->devices = ppgVar1;
  }
  if (params->n_gpu_layers != -1) {
    __return_storage_ptr__->n_gpu_layers = params->n_gpu_layers;
  }
  __return_storage_ptr__->main_gpu = params->main_gpu;
  __return_storage_ptr__->split_mode = params->split_mode;
  __return_storage_ptr__->tensor_split = params->tensor_split;
  __return_storage_ptr__->use_mmap = params->use_mmap;
  __return_storage_ptr__->use_mlock = params->use_mlock;
  __return_storage_ptr__->check_tensors = params->check_tensors;
  plVar4 = (params->kv_overrides).
           super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>.
           _M_impl.super__Vector_impl_data._M_start;
  plVar2 = (params->kv_overrides).
           super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (plVar4 == plVar2) {
    plVar4 = (pointer)0x0;
  }
  else if (plVar2[-1].key[0] != '\0') {
    pcVar6 = 
    "params.kv_overrides.back().key[0] == 0 && \"KV overrides not terminated with empty key\"";
    uVar7 = 0x433;
    goto LAB_001bb484;
  }
  __return_storage_ptr__->kv_overrides = plVar4;
  plVar5 = (params->tensor_buft_overrides).
           super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
           ._M_impl.super__Vector_impl_data._M_start;
  plVar3 = (params->tensor_buft_overrides).
           super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (plVar5 == plVar3) {
    plVar5 = (pointer)0x0;
  }
  else if (plVar3[-1].pattern != (char *)0x0) {
    pcVar6 = 
    "params.tensor_buft_overrides.back().pattern == nullptr && \"Tensor buffer overrides not terminated with empty pattern\""
    ;
    uVar7 = 0x43a;
LAB_001bb484:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
               ,uVar7,"GGML_ASSERT(%s) failed",pcVar6);
  }
  __return_storage_ptr__->tensor_buft_overrides = plVar5;
  return __return_storage_ptr__;
}

Assistant:

struct llama_model_params common_model_params_to_llama(common_params & params) {
    auto mparams = llama_model_default_params();

    if (!params.devices.empty()) {
        mparams.devices = params.devices.data();
    }

    if (params.n_gpu_layers != -1) {
        mparams.n_gpu_layers = params.n_gpu_layers;
    }

    mparams.main_gpu        = params.main_gpu;
    mparams.split_mode      = params.split_mode;
    mparams.tensor_split    = params.tensor_split;
    mparams.use_mmap        = params.use_mmap;
    mparams.use_mlock       = params.use_mlock;
    mparams.check_tensors   = params.check_tensors;

    if (params.kv_overrides.empty()) {
        mparams.kv_overrides = NULL;
    } else {
        GGML_ASSERT(params.kv_overrides.back().key[0] == 0 && "KV overrides not terminated with empty key");
        mparams.kv_overrides = params.kv_overrides.data();
    }

    if (params.tensor_buft_overrides.empty()) {
        mparams.tensor_buft_overrides = NULL;
    } else {
        GGML_ASSERT(params.tensor_buft_overrides.back().pattern == nullptr && "Tensor buffer overrides not terminated with empty pattern");
        mparams.tensor_buft_overrides = params.tensor_buft_overrides.data();
    }

    return mparams;
}